

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_things.cpp
# Opt level: O0

int P_Thing_Warp(AActor *caller,AActor *reference,double xofs,double yofs,double zofs,DAngle *angle,
                int flags,double heightoffset,double radiusoffset,DAngle *pitch)

{
  AActor *pAVar1;
  bool bVar2;
  uint uVar3;
  double dVar4;
  Angle *local_230;
  DVector3 local_218;
  TVector2<double> local_200;
  TFlags<ActorFlag2,_unsigned_int> local_1ec;
  DVector3 local_1e8;
  TVector3<double> local_1d0;
  TVector3<double> local_1b8;
  undefined1 local_1a0 [24];
  DVector3 displacedref;
  undefined1 local_168 [8];
  DVector3 displacedold_1;
  TVector3<double> local_138;
  undefined1 local_120 [24];
  DVector3 displacedold;
  TAngle<double> local_f0;
  TAngle<double> local_e8;
  DVector3 local_e0;
  DVector3 local_c8;
  double local_b0;
  double xofs1;
  double c;
  double s;
  double rad;
  int local_84;
  undefined1 local_80 [4];
  int oldpgroup;
  DVector3 old;
  AActor *temp;
  DAngle *pitch_local;
  double radiusoffset_local;
  double heightoffset_local;
  int flags_local;
  DAngle *angle_local;
  double zofs_local;
  double yofs_local;
  double xofs_local;
  AActor *reference_local;
  AActor *caller_local;
  
  xofs_local = (double)reference;
  reference_local = caller;
  if ((flags & 0x1000U) != 0) {
    old.Z = (double)reference;
    xofs_local = (double)caller;
    reference_local = reference;
  }
  AActor::Pos((DVector3 *)local_80,reference_local);
  local_84 = reference_local->Sector->PortalGroup;
  dVar4 = *(double *)((long)xofs_local + 0x180) * heightoffset + zofs;
  if ((flags & 2U) == 0) {
    pAVar1 = (AActor *)xofs_local;
    if ((flags & 4U) != 0) {
      pAVar1 = reference_local;
    }
    local_230 = &(pAVar1->Angles).Yaw;
    TAngle<double>::TAngle((TAngle<double> *)&rad,local_230);
    TAngle<double>::operator+=(angle,(TAngle<double> *)&rad);
  }
  s = radiusoffset * *(double *)((long)xofs_local + 0x178);
  c = TAngle<double>::Sin(angle);
  xofs1 = TAngle<double>::Cos(angle);
  if ((flags & 0x400U) == 0) {
    zofs_local = yofs;
    yofs_local = xofs;
    if ((flags & 1U) == 0) {
      yofs_local = xofs * xofs1 + yofs * c;
      zofs_local = xofs * c - yofs * xofs1;
      local_b0 = xofs;
    }
    if ((flags & 0x100U) == 0) {
      AActor::Vec3Offset(&local_e0,(AActor *)xofs_local,yofs_local + s * xofs1,zofs_local + s * c,
                         dVar4,false);
      AActor::SetOrigin(reference_local,&local_e0,true);
    }
    else {
      AActor::Vec3Offset(&local_c8,(AActor *)xofs_local,yofs_local + s * xofs1,zofs_local + s * c,
                         0.0,false);
      AActor::SetOrigin(reference_local,&local_c8,true);
      AActor::SetZ(reference_local,reference_local->floorz + dVar4,true);
    }
  }
  else {
    AActor::SetOrigin(reference_local,xofs + s * xofs1,yofs + s * c,dVar4,true);
    if ((flags & 0x100U) != 0) {
      AActor::SetZ(reference_local,reference_local->floorz + dVar4,true);
    }
  }
  if (((flags & 8U) != 0) || (bVar2 = P_TestMobjLocation(reference_local), bVar2)) {
    if ((flags & 0x200U) == 0) {
      TAngle<double>::operator=(&(reference_local->Angles).Yaw,angle);
      if ((flags & 0x8000U) != 0) {
        TAngle<double>::TAngle(&local_e8,(TAngle<double> *)((long)xofs_local + 0xa8));
        AActor::SetPitch(reference_local,&local_e8,false,false);
      }
      bVar2 = TAngle<double>::operator!=(pitch,0.0);
      if (bVar2) {
        TAngle<double>::TAngle((TAngle<double> *)&displacedold.Z,pitch);
        TAngle<double>::operator+(&local_f0,&(reference_local->Angles).Pitch);
        AActor::SetPitch(reference_local,&local_f0,false,false);
      }
      if ((flags & 0x4000U) != 0) {
        TVector3<double>::operator=
                  (&reference_local->Vel,(TVector3<double> *)((long)xofs_local + 200));
      }
      if ((flags & 0x80U) != 0) {
        TVector3<double>::Zero(&reference_local->Vel);
      }
      if ((flags & 0x20U) == 0) {
        if ((flags & 0x40U) == 0) {
          if ((flags & 0x10U) == 0) {
            AActor::ClearInterpolation(reference_local);
          }
        }
        else {
          FDisplacementTable::getOffset
                    ((FDisplacementTable *)&displacedref.Z,0x1af5e78,
                     *(int *)((long)xofs_local + 0x4b8));
          operator+((TVector3<double> *)local_168,(TVector3<double> *)local_80,
                    (Vector2 *)&displacedref.Z);
          FDisplacementTable::getOffset
                    ((FDisplacementTable *)local_1a0,0x1af5e78,
                     *(int *)(*(long *)((long)xofs_local + 0x130) + 0x208));
          operator+((TVector3<double> *)(local_1a0 + 0x10),(TVector3<double> *)local_80,
                    (Vector2 *)local_1a0);
          AActor::Pos(&local_1e8,reference_local);
          TVector3<double>::operator+(&local_1d0,&local_1e8,(TVector3<double> *)local_168);
          TVector3<double>::operator-(&local_1b8,&local_1d0,(TVector3<double> *)(local_1a0 + 0x10));
          TVector3<double>::operator=(&reference_local->Prev,&local_1b8);
          reference_local->PrevPortalGroup = reference_local->Sector->PortalGroup;
        }
      }
      else {
        FDisplacementTable::getOffset((FDisplacementTable *)local_120,0x1af5e78,local_84);
        operator+((TVector3<double> *)(local_120 + 0x10),(TVector3<double> *)local_80,
                  (Vector2 *)local_120);
        AActor::Pos((DVector3 *)&displacedold_1.Z,reference_local);
        TVector3<double>::operator-
                  (&local_138,(TVector3<double> *)&displacedold_1.Z,
                   (TVector3<double> *)(local_120 + 0x10));
        TVector3<double>::operator+=(&reference_local->Prev,&local_138);
        reference_local->PrevPortalGroup = reference_local->Sector->PortalGroup;
      }
      bVar2 = false;
      if ((flags & 0x800U) != 0) {
        TFlags<ActorFlag2,_unsigned_int>::operator&
                  (&local_1ec,SUB84(xofs_local,0) + (MF2_RIP|MF2_NOTELEPORT|MF2_SPAWNFLOAT));
        uVar3 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_1ec);
        bVar2 = uVar3 != 0;
      }
      if (bVar2) {
        dVar4 = AActor::GetBobOffset((AActor *)xofs_local,0.0);
        AActor::AddZ(reference_local,dVar4,true);
      }
      AActor::Pos(&local_218,reference_local);
      TVector2<double>::TVector2(&local_200,&local_218);
      P_TryMove(reference_local,&local_200,0,(secplane_t *)0x0);
    }
    else {
      AActor::SetOrigin(reference_local,(DVector3 *)local_80,true);
    }
    caller_local._4_4_ = 1;
  }
  else {
    AActor::SetOrigin(reference_local,(DVector3 *)local_80,true);
    caller_local._4_4_ = 0;
  }
  return caller_local._4_4_;
}

Assistant:

int P_Thing_Warp(AActor *caller, AActor *reference, double xofs, double yofs, double zofs, DAngle angle, int flags, double heightoffset, double radiusoffset, DAngle pitch)
{
	if (flags & WARPF_MOVEPTR)
	{
		AActor *temp = reference;
		reference = caller;
		caller = temp;
	}

	DVector3 old = caller->Pos();
	int oldpgroup = caller->Sector->PortalGroup;

	zofs += reference->Height * heightoffset;
	

	if (!(flags & WARPF_ABSOLUTEANGLE))
	{
		angle += (flags & WARPF_USECALLERANGLE) ? caller->Angles.Yaw: reference->Angles.Yaw;
	}

	const double rad = radiusoffset * reference->radius;
	const double s = angle.Sin();
	const double c = angle.Cos();

	if (!(flags & WARPF_ABSOLUTEPOSITION))
	{
		if (!(flags & WARPF_ABSOLUTEOFFSET))
		{
			double xofs1 = xofs;

			// (borrowed from A_SpawnItemEx, assumed workable)
			// in relative mode negative y values mean 'left' and positive ones mean 'right'
			// This is the inverse orientation of the absolute mode!
			
			xofs = xofs1 * c + yofs * s;
			yofs = xofs1 * s - yofs * c;
		}

		if (flags & WARPF_TOFLOOR)
		{
			// set correct xy
			// now the caller's floorz should be appropriate for the assigned xy-position
			// assigning position again with.
			// extra unlink, link and environment calculation
			caller->SetOrigin(reference->Vec3Offset(xofs + rad * c, yofs + rad * s, 0.), true);
			// The two-step process is important.
			caller->SetZ(caller->floorz + zofs);
		}
		else
		{
			caller->SetOrigin(reference->Vec3Offset(xofs + rad * c, yofs + rad * s, zofs), true);
		}
	}
	else // [MC] The idea behind "absolute" is meant to be "absolute". Override everything, just like A_SpawnItemEx's.
	{
		caller->SetOrigin(xofs + rad * c, yofs + rad * s, zofs, true);
		if (flags & WARPF_TOFLOOR)
		{
			caller->SetZ(caller->floorz + zofs);
		}
	}

	if ((flags & WARPF_NOCHECKPOSITION) || P_TestMobjLocation(caller))
	{
		if (flags & WARPF_TESTONLY)
		{
			caller->SetOrigin(old, true);
		}
		else
		{
			caller->Angles.Yaw = angle;

			if (flags & WARPF_COPYPITCH)
				caller->SetPitch(reference->Angles.Pitch, false);
			
			if (pitch != 0)
				caller->SetPitch(caller->Angles.Pitch + pitch, false);
			
			if (flags & WARPF_COPYVELOCITY)
			{
				caller->Vel = reference->Vel;
			}
			if (flags & WARPF_STOP)
			{
				caller->Vel.Zero();
			}

			// this is no fun with line portals 
			if (flags & WARPF_WARPINTERPOLATION)
			{
				// This just translates the movement but doesn't change the vector
				DVector3 displacedold  = old + Displacements.getOffset(oldpgroup, caller->Sector->PortalGroup);
				caller->Prev += caller->Pos() - displacedold;
				caller->PrevPortalGroup = caller->Sector->PortalGroup;
			}
			else if (flags & WARPF_COPYINTERPOLATION)
			{
				// Map both positions of the reference actor to the current portal group
				DVector3 displacedold = old + Displacements.getOffset(reference->PrevPortalGroup, caller->Sector->PortalGroup);
				DVector3 displacedref = old + Displacements.getOffset(reference->Sector->PortalGroup, caller->Sector->PortalGroup);
				caller->Prev = caller->Pos() + displacedold - displacedref;
				caller->PrevPortalGroup = caller->Sector->PortalGroup;
			}
			else if (!(flags & WARPF_INTERPOLATE))
			{
				caller->ClearInterpolation();
			}

			if ((flags & WARPF_BOB) && (reference->flags2 & MF2_FLOATBOB))
			{
				caller->AddZ(reference->GetBobOffset());
			}
			P_TryMove(caller, caller->Pos(), false);
		}
		return true;
	}
	caller->SetOrigin(old, true);
	return false;
}